

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListWindow.cpp
# Opt level: O3

void __thiscall cursespp::ListWindow::ScrollDown(ListWindow *this)

{
  int in_ESI;
  
  ScrollDown((ListWindow *)
             &this[-1].Invalidated.
              super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
              .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.m_mutex.
              __data.__list,in_ESI);
  return;
}

Assistant:

void ListWindow::ScrollDown(int delta) {
    IScrollAdapter& adapter = this->GetScrollAdapter();

    if (adapter.GetEntryCount() > 0) {
        ScrollPos spos = this->GetScrollPosition();

        size_t first = spos.firstVisibleEntryIndex;
        size_t last = first + spos.visibleEntryCount;
        size_t drawIndex = first;

        size_t maxIndex = adapter.GetEntryCount() - 1;
        size_t newIndex = this->selectedIndex + delta;
        newIndex = std::min(newIndex, maxIndex);

        if (newIndex >= last - 1) {
            drawIndex = drawIndex + delta;
        }

        this->SetSelectedIndex(newIndex);

        this->ScrollTo(drawIndex);

        /* when scrolling down it's possible for the last item to be
        the selection, and partially obscured. if we hit this case, we
        just continue scrolling until the selected item is completely
        visible to the user. */
        while (!IsSelectedItemCompletelyVisible()) {
            this->ScrollTo(++drawIndex);
        }
    }
}